

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

size_t __thiscall
tonk::OutgoingQueue::AppendSplitReliable
          (OutgoingQueue *this,uint messageType,uint8_t *messageData,size_t messageBytes)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ushort *puVar4;
  size_t in_RCX;
  void *in_RDX;
  short in_SI;
  long *in_RDI;
  uint8_t *messagePtr;
  uint writeBytes;
  uint bufferBytes;
  uint nextWriteOffset;
  OutgoingQueuedDatagram *datagram;
  uint headerWord;
  int local_64;
  size_t local_50;
  size_t local_30;
  
  lVar3 = in_RDI[1];
  if (lVar3 == 0) {
    local_30 = 0;
  }
  else {
    uVar1 = *(uint *)(lVar3 + 8);
    uVar2 = *(uint *)(*in_RDI + 0x1f0);
    if (uVar2 < uVar1 + 0x16) {
      local_30 = 0;
    }
    else {
      local_64 = (int)in_RCX + 2;
      if (uVar2 < uVar1 + local_64) {
        local_64 = uVar2 - uVar1;
        local_50 = (size_t)(local_64 - 2);
      }
      else {
        in_SI = in_SI + 6;
        local_50 = in_RCX;
      }
      puVar4 = (ushort *)(lVar3 + 0x10 + (ulong)uVar1);
      *puVar4 = in_SI << 0xb | (ushort)local_50;
      memcpy(puVar4 + 1,in_RDX,local_50);
      *(uint *)(lVar3 + 8) = uVar1 + local_64;
      *(int *)(in_RDI + 4) = local_64 + (int)in_RDI[4];
      local_30 = local_50;
    }
  }
  return local_30;
}

Assistant:

size_t OutgoingQueue::AppendSplitReliable(
    unsigned messageType,
    const uint8_t* messageData,
    size_t messageBytes)
{
    TONK_VERBOSE_OUTGOING_LOG("OutgoingQueue::AppendSplitReliable messageType=", messageType,
        " messageBytes=", messageBytes, " OutBuffer=", OutBuffer);

    OutgoingQueuedDatagram* datagram = OutBuffer;
    if (!datagram)
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: OutBuffer is null - abort");
        return 0;
    }

    const unsigned nextWriteOffset = datagram->NextWriteOffset;
    const unsigned bufferBytes = Common->MaxMessageSectionBytes;

    // If there is not enough room left in the datagram then return false
    if (nextWriteOffset + protocol::kMessageFrameBytes + protocol::kMessageSplitMinimumBytes > bufferBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: nextWriteOffset=", nextWriteOffset,
            " + overhead=", (protocol::kMessageFrameBytes + protocol::kMessageSplitMinimumBytes),
            " > bufferBytes=", bufferBytes);
        return 0;
    }

    unsigned writeBytes = static_cast<unsigned>(protocol::kMessageFrameBytes + messageBytes);

    // If there are more bytes to write than space available:
    if (nextWriteOffset + writeBytes > bufferBytes)
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: nextWriteOffset=", nextWriteOffset,
            " + writeBytes=", writeBytes, " > bufferBytes=", bufferBytes);

        TONK_DEBUG_ASSERT(bufferBytes >= nextWriteOffset);
        writeBytes = bufferBytes - nextWriteOffset;

        TONK_DEBUG_ASSERT(writeBytes >= protocol::kMessageFrameBytes);
        messageBytes = static_cast<size_t>(writeBytes - protocol::kMessageFrameBytes);

        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: Now writeBytes=", writeBytes,
            " messageBytes=", messageBytes);
    }
    else
    {
        TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: FINAL MESSAGE");

        messageType += TonkChannel_Count; // Mark as final message
    }

    uint8_t* messagePtr = datagram->Data + nextWriteOffset;

    // Write 2-byte message frame header
    protocol::WriteMessageFrameHeader(
        messagePtr,
        messageType,
        static_cast<unsigned>(messageBytes));

    // Copy message into place
    memcpy(messagePtr + protocol::kMessageFrameBytes, messageData, messageBytes);

    TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_Reliable);

    // Record that the data was written
    datagram->NextWriteOffset = nextWriteOffset + writeBytes;

    // Update queued bytes
    QueuedBytes += writeBytes;

    TONK_VERBOSE_OUTGOING_LOG("AppendSplitReliable: WROTE TO DATAGRAM datagram->NextWriteOffset=",
        datagram->NextWriteOffset, " + writeBytes=", writeBytes, " MaxMessageSectionBytes=",
        Common->MaxMessageSectionBytes, " QueuedBytes=", QueuedBytes);

#ifdef TONK_DETAILED_STATS
    datagram->AddMessageStats(messageType, static_cast<unsigned>(messageBytes));
#endif // TONK_DETAILED_STATS

    return messageBytes;
}